

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O3

void zt_mem_heap_destroy(zt_mem_heap **heap)

{
  if (heap != (zt_mem_heap **)0x0) {
    free((*heap)->name);
    (*heap)->name = (char *)0x0;
    free(*heap);
    *heap = (zt_mem_heap *)0x0;
  }
  return;
}

Assistant:

void
zt_mem_heap_destroy(zt_mem_heap **heap)
{
    if (!heap) {
        return;
    }

    GLOBAL_zmt.dealloc((*heap)->name);
    (*heap)->name = 0;
    (*heap)->size = 0;

    GLOBAL_zmt.dealloc(*heap);
    *heap = 0;
}